

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

bool __thiscall BasicBlock::Contains(BasicBlock *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  Instr *pIVar3;
  undefined4 *puVar4;
  Instr *local_48;
  Instr *local_38;
  Instr *blockInstr;
  Instr *blockInstrStop;
  Instr *__prevInstrCheck;
  Instr *instr_local;
  BasicBlock *this_local;
  
  blockInstrStop = (Instr *)0x0;
  pIVar3 = GetLastInstr(this);
  if (pIVar3 == (Instr *)0x0) {
    local_48 = (Instr *)0x0;
  }
  else {
    pIVar3 = GetLastInstr(this);
    local_48 = pIVar3->m_next;
  }
  local_38 = GetFirstInstr(this);
  while( true ) {
    if (local_38 == local_48) {
      return false;
    }
    if ((blockInstrStop != (Instr *)0x0) && (blockInstrStop->m_next != local_38)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xe7c,
                         "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == blockInstr)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    blockInstrStop = local_38;
    if (instr == local_38) break;
    local_38 = local_38->m_next;
  }
  return true;
}

Assistant:

bool
BasicBlock::Contains(IR::Instr * instr)
{
    FOREACH_INSTR_IN_BLOCK(blockInstr, this)
    {
        if (instr == blockInstr)
        {
            return true;
        }
    }
    NEXT_INSTR_IN_BLOCK;
    return false;
}